

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O3

string * __thiscall
soul::Structure::addMemberWithUniqueName
          (string *__return_storage_ptr__,Structure *this,Type *type,string *memberName)

{
  long *plVar1;
  pointer pcVar2;
  uint uVar3;
  bool bVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  uint __uval;
  uint __val;
  uint __len;
  string_view memberName_00;
  string *newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  Structure *local_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  undefined8 local_88;
  long local_80;
  undefined8 uStack_78;
  Type *local_70;
  Type local_68;
  string local_50;
  
  local_d8 = local_c8;
  local_b8 = this;
  if (memberName->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"temp","");
  }
  else {
    pcVar2 = (memberName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar2,pcVar2 + memberName->_M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_70 = type;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_d8,local_d0 + (long)local_d8);
  uVar6 = 1;
  do {
    memberName_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    memberName_00._M_len = __return_storage_ptr__->_M_string_length;
    bVar4 = hasMemberWithName(local_b8,memberName_00);
    if (!bVar4) {
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      local_68.category = local_70->category;
      local_68.arrayElementCategory = local_70->arrayElementCategory;
      local_68.isRef = local_70->isRef;
      local_68.isConstant = local_70->isConstant;
      local_68.primitiveType.type = (local_70->primitiveType).type;
      local_68.boundingSize = local_70->boundingSize;
      local_68.arrayElementBoundingSize = local_70->arrayElementBoundingSize;
      local_68.structure.object = (local_70->structure).object;
      (local_70->structure).object = (Structure *)0x0;
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
      addMember(local_b8,&local_68,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_68.structure.object);
      return __return_storage_ptr__;
    }
    local_f8 = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d8,local_d0 + (long)local_d8);
    std::__cxx11::string::append((char *)&local_f8);
    __val = uVar6 + 1;
    __len = 1;
    if (8 < uVar6) {
      uVar6 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar6 < 100) {
          __len = __len - 2;
          goto LAB_001b9e17;
        }
        if (uVar6 < 1000) {
          __len = __len - 1;
          goto LAB_001b9e17;
        }
        if (uVar6 < 10000) goto LAB_001b9e17;
        bVar4 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar3 = __len + 4;
      } while (bVar4);
      __len = __len + 1;
    }
LAB_001b9e17:
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,__len,__val);
    uVar7 = 0xf;
    if (local_f8 != local_e8) {
      uVar7 = local_e8[0];
    }
    if (uVar7 < (ulong)(local_a8 + local_f0)) {
      uVar7 = 0xf;
      if (local_b0 != local_a0) {
        uVar7 = local_a0[0];
      }
      if (uVar7 < (ulong)(local_a8 + local_f0)) goto LAB_001b9e83;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_001b9e83:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b0);
    }
    plVar1 = puVar5 + 2;
    if ((long *)*puVar5 == plVar1) {
      local_80 = *plVar1;
      uStack_78 = puVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar1;
      local_90 = (long *)*puVar5;
    }
    local_88 = puVar5[1];
    *puVar5 = plVar1;
    puVar5[1] = 0;
    *(undefined1 *)plVar1 = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    uVar6 = __val;
    if (local_f8 != local_e8) {
      operator_delete(local_f8,local_e8[0] + 1);
    }
  } while( true );
}

Assistant:

std::string Structure::addMemberWithUniqueName (Type type, const std::string& memberName)
{
    auto newName = addSuffixToMakeUnique (memberName.empty() ? "temp" : memberName,
                                          [this] (const std::string& nm) { return hasMemberWithName (nm); });
    addMember (std::move (type), newName);
    return newName;
}